

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

void Gia_ManEquivImprove(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  
  if ((p->pReprs == (Gia_Rpr_t *)0x0) || (p->pNexts == (int *)0x0)) {
    __assert_fail("p->pReprs != NULL && p->pNexts != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x6bc,"void Gia_ManEquivImprove(Gia_Man_t *)");
  }
  Gia_ManLevelNum(p);
  Gia_ManCreateRefs(p);
  p_00 = Vec_IntAlloc(100);
  uVar9 = 1;
  do {
    if ((long)p->nObjs <= (long)uVar9) {
      Vec_IntFree(p_00);
      if (p->pNexts != (int *)0x0) {
        free(p->pNexts);
        p->pNexts = (int *)0x0;
      }
      return;
    }
    iVar1 = Gia_ObjIsHead(p,(int)uVar9);
    if (iVar1 != 0) {
      p_00->nSize = 0;
      iVar1 = 1000000000;
      uVar5 = 0xffffffffffffffff;
      iVar6 = 1000000000;
      for (uVar8 = uVar9 & 0xffffffff; iVar7 = (int)uVar8, 0 < iVar7;
          uVar8 = (ulong)(uint)p->pNexts[uVar8]) {
        pGVar4 = Gia_ManObj(p,iVar7);
        iVar2 = Gia_ObjLevel(p,pGVar4);
        pGVar4 = Gia_ManObj(p,iVar7);
        iVar3 = Gia_NodeMffcSize(p,pGVar4);
        if ((iVar2 < iVar1) || ((iVar1 == iVar2 && (iVar3 < iVar6)))) {
          uVar5 = uVar8;
          iVar1 = iVar2;
          iVar6 = iVar3;
        }
        Vec_IntPush(p_00,iVar7);
      }
      iVar1 = p_00->nSize;
      if (iVar1 < 2) {
        __assert_fail("Vec_IntSize( vClass ) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                      ,0x6d2,"void Gia_ManEquivImprove(Gia_Man_t *)");
      }
      iVar6 = (int)uVar5;
      if (iVar6 < 1) {
        __assert_fail("iReprBest > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                      ,0x6d3,"void Gia_ManEquivImprove(Gia_Man_t *)");
      }
      uVar5 = uVar5 & 0xffffffff;
      if (uVar9 != uVar5) {
        p->pReprs[uVar5] = (Gia_Rpr_t)((uint)p->pReprs[uVar5] | 0xfffffff);
        p->pReprs[uVar9] = (Gia_Rpr_t)((uint)p->pReprs[uVar9] | 0x10000000);
        p->pReprs[uVar5] = (Gia_Rpr_t)((uint)p->pReprs[uVar5] & 0xefffffff);
        for (iVar7 = 0; iVar1 != iVar7; iVar7 = iVar7 + 1) {
          iVar2 = Vec_IntEntry(p_00,iVar7);
          if (iVar2 != iVar6) {
            Gia_ObjSetRepr(p,iVar2,iVar6);
          }
        }
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void Gia_ManEquivImprove( Gia_Man_t * p )
{
    Vec_Int_t * vClass;
    int i, k, iNode, iRepr;
    int iReprBest, iLevelBest, iLevelCur, iMffcBest, iMffcCur;
    assert( p->pReprs != NULL && p->pNexts != NULL );
    Gia_ManLevelNum( p );
    Gia_ManCreateRefs( p );
    // iterate over class candidates
    vClass = Vec_IntAlloc( 100 );
    Gia_ManForEachClass( p, i )
    {
        Vec_IntClear( vClass );
        iReprBest = -1;
        iLevelBest = iMffcBest = ABC_INFINITY;
        Gia_ClassForEachObj( p, i, k )
        {
            iLevelCur = Gia_ObjLevel( p,Gia_ManObj(p, k) );
            iMffcCur  = Gia_NodeMffcSize( p, Gia_ManObj(p, k) );
            if ( iLevelBest > iLevelCur || (iLevelBest == iLevelCur && iMffcBest > iMffcCur) )
            {
                iReprBest  = k;
                iLevelBest = iLevelCur;
                iMffcBest  = iMffcCur;
            }
            Vec_IntPush( vClass, k );
        }
        assert( Vec_IntSize( vClass ) > 1 );
        assert( iReprBest > 0 );
        if ( i == iReprBest )
            continue;
/*
        Abc_Print( 1, "Repr/Best = %6d/%6d. Lev = %3d/%3d. Mffc = %3d/%3d.\n", 
            i, iReprBest, Gia_ObjLevel( p,Gia_ManObj(p, i) ), Gia_ObjLevel( p,Gia_ManObj(p, iReprBest) ),
            Gia_NodeMffcSize( p, Gia_ManObj(p, i) ), Gia_NodeMffcSize( p, Gia_ManObj(p, iReprBest) ) );
*/
        iRepr = iReprBest;
        Gia_ObjSetRepr( p, iRepr, GIA_VOID );
        Gia_ObjSetProved( p, i );
        Gia_ObjUnsetProved( p, iRepr );
        Vec_IntForEachEntry( vClass, iNode, k )
            if ( iNode != iRepr )
                Gia_ObjSetRepr( p, iNode, iRepr );
    }
    Vec_IntFree( vClass );
    ABC_FREE( p->pNexts );
//    p->pNexts = Gia_ManDeriveNexts( p );
}